

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O2

Sexp * Builtin_Div(Sexp *fst,Sexp *snd)

{
  double dVar1;
  Sexp *pSVar2;
  JetRuntimeException *pJVar3;
  string local_98;
  string local_78;
  string local_58;
  Sexp *local_38;
  Sexp *fst_local;
  Sexp *snd_local;
  FrameProtector __frame_prot;
  
  local_38 = fst;
  fst_local = snd;
  FrameProtector::FrameProtector((FrameProtector *)&snd_local,"Builtin_Div");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,&local_38,"fst");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,&fst_local,"snd");
  if (local_38->kind != FIXNUM) {
    pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_98,"type error: not a fixnum",
               (allocator *)((long)&__frame_prot.protected_frame + 7));
    JetRuntimeException::JetRuntimeException(pJVar3,&local_98);
    __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  if (fst_local->kind == FIXNUM) {
    dVar1 = (fst_local->field_1).fixnum_value;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"divided by zero",
                 (allocator *)((long)&__frame_prot.protected_frame + 7));
      JetRuntimeException::JetRuntimeException(pJVar3,&local_58);
      __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
    }
    pSVar2 = GcHeap::AllocateFixnum((local_38->field_1).fixnum_value / dVar1);
    FrameProtector::~FrameProtector((FrameProtector *)&snd_local);
    return pSVar2;
  }
  pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_78,"type error: not a fixnum",
             (allocator *)((long)&__frame_prot.protected_frame + 7));
  JetRuntimeException::JetRuntimeException(pJVar3,&local_78);
  __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Builtin_Div(Sexp *fst, Sexp *snd) {
  GC_HELPER_FRAME;
  GC_PROTECT(fst);
  GC_PROTECT(snd);

  if (!fst->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (!snd->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (snd->fixnum_value == 0) {
    throw JetRuntimeException("divided by zero");
  }

  return GcHeap::AllocateFixnum(fst->fixnum_value / snd->fixnum_value);
}